

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_mthd_invalid.cc
# Opt level: O3

void __thiscall hwtest::pgraph::anon_unknown_1::MthdInvalidTest::emulate_mthd(MthdInvalidTest *this)

{
  uint32_t *puVar1;
  uint uVar2;
  uint uVar3;
  
  uVar2 = (this->super_MthdTest).super_StateTest.exp.invalid;
  if ((uVar2 >> 0x10 & 1) == 0) {
    uVar3 = (this->super_MthdTest).super_StateTest.exp.intr;
    (this->super_MthdTest).super_StateTest.exp.intr = uVar3 | 1;
    (this->super_MthdTest).super_StateTest.exp.invalid = uVar2 | 1;
    if ((this->super_MthdTest).super_StateTest.super_RepeatTest.super_Test.chipset.card_type < 3) {
      puVar1 = &(this->super_MthdTest).super_StateTest.exp.access;
      *puVar1 = *puVar1 & 0xfffffefe;
      return;
    }
    (this->super_MthdTest).super_StateTest.exp.fifo_enable = 0;
    if (((uVar2 & 0x10) == 0) &&
       (uVar2 = (this->super_MthdTest).super_StateTest.exp.notify,
       (uVar2 & 0xf00000) != 0 && (uVar2 >> 0x10 & 1) != 0)) {
      (this->super_MthdTest).super_StateTest.exp.intr = uVar3 | 0x10000001;
    }
  }
  return;
}

Assistant:

void emulate_mthd() override {
		if (!extr(exp.invalid, 16, 1)) {
			exp.intr |= 1;
			exp.invalid |= 1;
			if (chipset.card_type < 3) {
				exp.access &= ~0x101;
			} else {
				exp.fifo_enable = 0;
				if (!extr(exp.invalid, 4, 1)) {
					if (extr(exp.notify, 16, 1) && extr(exp.notify, 20, 4)) {
						exp.intr |= 1 << 28;
					}
				}
			}
		}
	}